

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

int Gia_ManTerRetire2(Gia_ManTer_t *p,uint *pState)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = p->pAig->nRegs;
  bVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar4 = -1;
  for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if (((~(pState[uVar6 >> 4 & 0xfffffff] >> (bVar3 & 0x1e)) & 3) != 0) &&
       (p->pRetired[uVar6] == '\0')) {
      if (iVar4 <= p->pCountX[uVar6]) {
        iVar4 = p->pCountX[uVar6];
      }
    }
    bVar3 = bVar3 + 2;
  }
  if (iVar4 < 0) {
    __assert_fail("iMaxTerValue >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTsim.c"
                  ,0x1a6,"int Gia_ManTerRetire2(Gia_ManTer_t *, unsigned int *)");
  }
  bVar3 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)(int)uVar1; uVar5 = uVar5 + 1) {
    if ((((~(pState[uVar5 >> 4 & 0xfffffff] >> (bVar3 & 0x1e)) & 3) != 0) &&
        (p->pRetired[uVar5] == '\0')) && (iVar4 == p->pCountX[uVar5])) {
      p->pRetired[uVar5] = '\x01';
      Vec_IntPush(p->vRetired,(int)uVar5);
      if (iVar4 == 0) break;
      uVar1 = p->pAig->nRegs;
    }
    bVar3 = bVar3 + 2;
  }
  iVar4 = 0;
  while( true ) {
    iVar2 = p->vRetired->nSize;
    if (iVar2 <= iVar4) break;
    iVar2 = Vec_IntEntry(p->vRetired,iVar4);
    Gia_ManTerSimInfoSet(p->pDataSimCis,(iVar2 + p->pAig->vCis->nSize) - p->pAig->nRegs,3);
    iVar4 = iVar4 + 1;
  }
  return iVar2;
}

Assistant:

int Gia_ManTerRetire2( Gia_ManTer_t * p, unsigned * pState )
{
    int i, Entry, iMaxTerValue = -1;
    // find non-retired register with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue < p->pCountX[i] )
            iMaxTerValue = p->pCountX[i];
    assert( iMaxTerValue >= 0 );
    // retire the first registers with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue == p->pCountX[i] )
        {
            assert( p->pRetired[i] == 0 );
            p->pRetired[i] = 1;
            Vec_IntPush( p->vRetired, i );
            if ( iMaxTerValue == 0 )
                break;
        }
    // update all the retired registers
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}